

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadLocalStorage.h
# Opt level: O2

void TLS::BASE<tls_data_t,_1024U>::_details::thread_exiting(void *value)

{
  ulong uVar1;
  lock_guard<TLS::BASE<tls_data_t,_1024U>::_details> lock;
  lock_guard<TLS::BASE<tls_data_t,_1024U>::_details> local_20;
  
  pthread_setspecific(BASE<tls_data_t,1024u>::_details::_pthread_key,(void *)0x0);
  std::lock_guard<TLS::BASE<tls_data_t,_1024U>::_details>::lock_guard
            (&local_20,(mutex_type *)BASE<tls_data_t,1024u>::_d);
  if (BASE<tls_data_t,1024u>::_details::_thread_exit_callback !=
      (function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)> *)0x0) {
    std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::operator()
              (BASE<tls_data_t,1024u>::_details::_thread_exit_callback,
               (data_t *)(BASE<tls_data_t,1024u>::_d + ((ulong)value & 0xffffffff) * 0x18 + 0x40));
  }
  *(undefined4 *)(BASE<tls_data_t,1024u>::_d + ((ulong)value & 0xffffffff) * 0x18 + 0x48) =
       0xffffffff;
  uVar1 = (ulong)(uint)BASE<tls_data_t,1024u>::_d._28736_4_;
  BASE<tls_data_t,1024u>::_d._28736_4_ = BASE<tls_data_t,1024u>::_d._28736_4_ + 1;
  *(int *)(BASE<tls_data_t,1024u>::_d + uVar1 * 4 + 0x6040) = (int)value;
  (local_20._M_device)->_lock = 0;
  return;
}

Assistant:

static void thread_exiting(void * value)
#endif
			{
#ifndef _MSC_VER
				pthread_setspecific(_pthread_key, NULL);
#endif
				uint32_t index = (uint32_t)(uintptr_t)value;
				TLS_ASSERT_(index < MAX_THREADS);
				{
					std::lock_guard<_details> lock(_d);
					TLS_ASSERT_(_d._data[index]._index == index);
					if (_thread_exit_callback)
						_thread_exit_callback->operator()(_d._data[index]);
					_d._data[index]._index = UNUSED_INDEX;
					_d._available_ids[_d._available_id_index++] = index;
					TLS_ASSERT_(_d._available_id_index <= MAX_THREADS);
				}
			}